

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  _Node **pp_Var1;
  ulong uVar2;
  char *pcVar3;
  DescriptorPool *pool_00;
  Tables *this_00;
  string *name_00;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  _Node *p_Var7;
  char cVar8;
  char *pcVar9;
  Symbol *pSVar10;
  _Node *p_Var12;
  Type TVar13;
  Symbol SVar14;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  string *local_38;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar11;
  
  local_40.mu_ = pool->mutex_;
  if (local_40.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_40.mu_);
  }
  pp_Var1 = (this->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  uVar2 = (this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  pcVar3 = (name->_M_dataplus)._M_p;
  cVar8 = *pcVar3;
  if (cVar8 == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    pcVar9 = pcVar3;
    do {
      pcVar9 = pcVar9 + 1;
      uVar6 = (long)cVar8 + uVar6 * 5;
      cVar8 = *pcVar9;
    } while (cVar8 != '\0');
  }
  local_38 = name;
  for (p_Var12 = pp_Var1[uVar6 % uVar2]; p_Var12 != (_Node *)0x0; p_Var12 = p_Var12->_M_next) {
    iVar5 = strcmp(pcVar3,(p_Var12->_M_v).first);
    if (iVar5 == 0) {
      p_Var7 = pp_Var1[uVar2];
      goto LAB_001cac95;
    }
  }
  p_Var7 = pp_Var1[uVar2];
  p_Var12 = p_Var7;
LAB_001cac95:
  name_00 = local_38;
  pSVar10 = &(p_Var12->_M_v).second;
  if (p_Var12 == p_Var7) {
    pSVar10 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
  }
  aVar11 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar10->field_1).descriptor;
  TVar13 = pSVar10->type;
  if (TVar13 == NULL_SYMBOL) {
    pool_00 = pool->underlay_;
    if (pool_00 != (DescriptorPool *)0x0) {
      this_00 = (pool_00->tables_).ptr_;
      if (this_00 == (Tables *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      SVar14 = FindByNameHelper(this_00,pool_00,local_38);
      aVar11 = SVar14.field_1;
      TVar13 = SVar14.type;
      if (TVar13 != NULL_SYMBOL) goto LAB_001cacbb;
    }
    bVar4 = TryFindSymbolInFallbackDatabase(pool,name_00);
    TVar13 = NULL_SYMBOL;
    if (bVar4) {
      pp_Var1 = (this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      uVar2 = (this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      pcVar3 = (name_00->_M_dataplus)._M_p;
      cVar8 = *pcVar3;
      if (cVar8 == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        pcVar9 = pcVar3;
        do {
          pcVar9 = pcVar9 + 1;
          uVar6 = (long)cVar8 + uVar6 * 5;
          cVar8 = *pcVar9;
        } while (cVar8 != '\0');
      }
      for (p_Var12 = pp_Var1[uVar6 % uVar2]; p_Var12 != (_Node *)0x0; p_Var12 = p_Var12->_M_next) {
        iVar5 = strcmp(pcVar3,(p_Var12->_M_v).first);
        if (iVar5 == 0) {
          p_Var7 = pp_Var1[uVar2];
          goto LAB_001cad7d;
        }
      }
      p_Var7 = pp_Var1[uVar2];
      p_Var12 = p_Var7;
LAB_001cad7d:
      pSVar10 = &(p_Var12->_M_v).second;
      if (p_Var12 == p_Var7) {
        pSVar10 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
      }
      aVar11 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar10->field_1).descriptor;
      TVar13 = pSVar10->type;
    }
  }
LAB_001cacbb:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_40);
  SVar14._4_4_ = 0;
  SVar14.type = TVar13;
  SVar14.field_1.descriptor = aVar11.descriptor;
  return SVar14;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(
    const DescriptorPool* pool, const string& name) const {
  MutexLockMaybe lock(pool->mutex_);
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result =
      pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}